

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void __thiscall tinyxml2::MemPoolT<88>::Free(MemPoolT<88> *this,void *mem)

{
  if (mem != (void *)0x0) {
    this->_currentAllocs = this->_currentAllocs + -1;
    *(Chunk **)mem = this->_root;
    this->_root = (Chunk *)mem;
  }
  return;
}

Assistant:

virtual void Free( void* mem ) {
        if ( !mem ) {
            return;
        }
        --_currentAllocs;
        Chunk* chunk = static_cast<Chunk*>( mem );
#ifdef DEBUG
        memset( chunk, 0xfe, sizeof(Chunk) );
#endif
        chunk->next = _root;
        _root = chunk;
    }